

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_request_response(Channel *chan,_Bool success)

{
  uint n;
  PacketProtocolLayer *ppl_00;
  LogContext *pLVar1;
  uint *mc_00;
  char *pcVar2;
  int j;
  PacketProtocolLayer *ppl;
  mainchan *mc;
  _Bool success_local;
  Channel *chan_local;
  
  if (chan->vt != &mainchan_channelvt) {
    __assert_fail("chan->vt == &mainchan_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c"
                  ,0xdb,"void mainchan_request_response(Channel *, _Bool)");
  }
  mc_00 = &chan[-5].initial_fixed_window_size;
  ppl_00 = *(PacketProtocolLayer **)&chan[-4].initial_fixed_window_size;
  if ((chan[-3].field_0xd & 1) == 0) {
    if ((chan[-3].field_0xe & 1) == 0) {
      if ((chan[-3].field_0xf & 1) == 0) {
        if ((int)chan[-2].initial_fixed_window_size < *(int *)((long)&chan[-2].vt + 4)) {
          n = chan[-2].initial_fixed_window_size;
          chan[-2].initial_fixed_window_size = n + 1;
          if (!success) {
            pLVar1 = ppl_00->logctx;
            pcVar2 = conf_get_str_nthstrkey((Conf *)chan[-4].vt,0x38,n);
            pcVar2 = dupprintf("Server refused to set environment variable %s",pcVar2);
            logevent_and_free(pLVar1,pcVar2);
            *(int *)&chan[-2].field_0xc = *(int *)&chan[-2].field_0xc + 1;
          }
          if (chan[-2].initial_fixed_window_size == *(uint *)((long)&chan[-2].vt + 4)) {
            if (*(int *)&chan[-2].field_0xc == 0) {
              pLVar1 = ppl_00->logctx;
              pcVar2 = dupprintf("All environment variables successfully set");
              logevent_and_free(pLVar1,pcVar2);
            }
            else if (*(int *)&chan[-2].field_0xc == *(int *)((long)&chan[-2].vt + 4)) {
              pLVar1 = ppl_00->logctx;
              pcVar2 = dupprintf("All environment variables refused");
              logevent_and_free(pLVar1,pcVar2);
              pcVar2 = dupprintf("Server refused to set environment variables\r\n");
              ssh_ppl_user_output_string_and_free(ppl_00,pcVar2);
            }
            else {
              pcVar2 = dupprintf("Server refused to set all environment variables\r\n");
              ssh_ppl_user_output_string_and_free(ppl_00,pcVar2);
            }
          }
        }
        else if (((ulong)chan[-2].vt & 1) == 0) {
          if (((ulong)chan[-2].vt & 0x100) != 0) {
            *(undefined1 *)((long)&chan[-2].vt + 1) = 0;
            if (success) {
              pLVar1 = ppl_00->logctx;
              pcVar2 = dupprintf("Started a shell/command");
              logevent_and_free(pLVar1,pcVar2);
              ssh_got_fallback_cmd(*(Ssh **)(*(long *)&chan[-4].initial_fixed_window_size + 0x58));
              mainchan_ready((mainchan *)mc_00);
            }
            else {
              ssh_sw_abort_deferred
                        (*(Ssh **)(*(long *)&chan[-4].initial_fixed_window_size + 0x58),
                         "Server refused to start a shell/command");
            }
          }
        }
        else {
          *(undefined1 *)&chan[-2].vt = 0;
          if (success) {
            pLVar1 = ppl_00->logctx;
            pcVar2 = dupprintf("Started a shell/command");
            logevent_and_free(pLVar1,pcVar2);
            mainchan_ready((mainchan *)mc_00);
          }
          else {
            pcVar2 = conf_get_str((Conf *)chan[-4].vt,0x15);
            if (*pcVar2 == '\0') {
              ssh_sw_abort_deferred
                        (*(Ssh **)(*(long *)&chan[-4].initial_fixed_window_size + 0x58),
                         "Server refused to start a shell/command");
            }
            else {
              pLVar1 = ppl_00->logctx;
              pcVar2 = dupprintf("Primary command failed; attempting fallback");
              logevent_and_free(pLVar1,pcVar2);
              mainchan_try_fallback_command((mainchan *)mc_00);
            }
          }
        }
      }
      else {
        chan[-3].field_0xf = 0;
        if (success) {
          pLVar1 = ppl_00->logctx;
          pcVar2 = dupprintf("Allocated pty");
          logevent_and_free(pLVar1,pcVar2);
          *(undefined1 *)((long)&chan[-1].vt + 2) = 1;
        }
        else {
          pLVar1 = ppl_00->logctx;
          pcVar2 = dupprintf("Server refused to allocate pty");
          logevent_and_free(pLVar1,pcVar2);
          pcVar2 = dupprintf("Server refused to allocate pty\r\n");
          ssh_ppl_user_output_string_and_free(ppl_00,pcVar2);
          ssh_set_ldisc_option((ConnectionLayer *)chan[-3].vt,1,true);
          ssh_set_ldisc_option((ConnectionLayer *)chan[-3].vt,0,true);
        }
      }
    }
    else {
      chan[-3].field_0xe = 0;
      if (success) {
        pLVar1 = ppl_00->logctx;
        pcVar2 = dupprintf("Agent forwarding enabled");
        logevent_and_free(pLVar1,pcVar2);
      }
      else {
        pLVar1 = ppl_00->logctx;
        pcVar2 = dupprintf("Agent forwarding refused");
        logevent_and_free(pLVar1,pcVar2);
      }
    }
  }
  else {
    chan[-3].field_0xd = 0;
    if (success) {
      pLVar1 = ppl_00->logctx;
      pcVar2 = dupprintf("X11 forwarding enabled");
      logevent_and_free(pLVar1,pcVar2);
      ssh_enable_x_fwd((ConnectionLayer *)chan[-3].vt);
    }
    else {
      pLVar1 = ppl_00->logctx;
      pcVar2 = dupprintf("X11 forwarding refused");
      logevent_and_free(pLVar1,pcVar2);
    }
  }
  return;
}

Assistant:

static void mainchan_request_response(Channel *chan, bool success)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    if (mc->req_x11) {
        mc->req_x11 = false;

        if (success) {
            ppl_logevent("X11 forwarding enabled");
            ssh_enable_x_fwd(mc->cl);
        } else {
            ppl_logevent("X11 forwarding refused");
        }
        return;
    }

    if (mc->req_agent) {
        mc->req_agent = false;

        if (success) {
            ppl_logevent("Agent forwarding enabled");
        } else {
            ppl_logevent("Agent forwarding refused");
        }
        return;
    }

    if (mc->req_pty) {
        mc->req_pty = false;

        if (success) {
            ppl_logevent("Allocated pty");
            mc->got_pty = true;
        } else {
            ppl_logevent("Server refused to allocate pty");
            ppl_printf("Server refused to allocate pty\r\n");
            ssh_set_ldisc_option(mc->cl, LD_ECHO, true);
            ssh_set_ldisc_option(mc->cl, LD_EDIT, true);
        }
        return;
    }

    if (mc->n_env_replies < mc->n_req_env) {
        int j = mc->n_env_replies++;
        if (!success) {
            ppl_logevent("Server refused to set environment variable %s",
                         conf_get_str_nthstrkey(mc->conf,
                                                CONF_environmt, j));
            mc->n_env_fails++;
        }

        if (mc->n_env_replies == mc->n_req_env) {
            if (mc->n_env_fails == 0) {
                ppl_logevent("All environment variables successfully set");
            } else if (mc->n_env_fails == mc->n_req_env) {
                ppl_logevent("All environment variables refused");
                ppl_printf("Server refused to set environment "
                           "variables\r\n");
            } else {
                ppl_printf("Server refused to set all environment "
                           "variables\r\n");
            }
        }
        return;
    }

    if (mc->req_cmd_primary) {
        mc->req_cmd_primary = false;

        if (success) {
            ppl_logevent("Started a shell/command");
            mainchan_ready(mc);
        } else if (*conf_get_str(mc->conf, CONF_remote_cmd2)) {
            ppl_logevent("Primary command failed; attempting fallback");
            mainchan_try_fallback_command(mc);
        } else {
            /*
             * If there's no remote_cmd2 configured, then we have no
             * fallback command, so we've run out of options.
             */
            ssh_sw_abort_deferred(mc->ppl->ssh,
                                  "Server refused to start a shell/command");
        }
        return;
    }

    if (mc->req_cmd_fallback) {
        mc->req_cmd_fallback = false;

        if (success) {
            ppl_logevent("Started a shell/command");
            ssh_got_fallback_cmd(mc->ppl->ssh);
            mainchan_ready(mc);
        } else {
            ssh_sw_abort_deferred(mc->ppl->ssh,
                                  "Server refused to start a shell/command");
        }
        return;
    }
}